

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

void opencheck(lua_State *L,char *fname,char *mode)

{
  undefined8 *puVar1;
  FILE *pFVar2;
  
  puVar1 = (undefined8 *)lua_newuserdatauv(L,0x10,0);
  puVar1[1] = 0;
  luaL_setmetatable(L,"FILE*");
  *puVar1 = 0;
  puVar1[1] = io_fclose;
  pFVar2 = fopen64(fname,mode);
  *puVar1 = pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    opencheck();
  }
  return;
}

Assistant:

static void opencheck (lua_State *L, const char *fname, const char *mode) {
  LStream *p = newfile(L);
  p->f = fopen(fname, mode);
  if (l_unlikely(p->f == NULL))
    luaL_error(L, "cannot open file '%s' (%s)", fname, strerror(errno));
}